

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_byteorder.c
# Opt level: O0

PHYSFS_uint64 PHYSFS_Swap64(PHYSFS_uint64 val)

{
  PHYSFS_uint32 PVar1;
  PHYSFS_uint32 PVar2;
  PHYSFS_uint32 lo;
  PHYSFS_uint32 hi;
  PHYSFS_uint64 val_local;
  
  PVar1 = PHYSFS_Swap32((PHYSFS_uint32)val);
  PVar2 = PHYSFS_Swap32((PHYSFS_uint32)(val >> 0x20));
  return CONCAT44(PVar1,PVar2);
}

Assistant:

static inline PHYSFS_uint64 PHYSFS_Swap64(PHYSFS_uint64 val) {
    PHYSFS_uint32 hi, lo;

    /* Separate into high and low 32-bit values and swap them */
    lo = (PHYSFS_uint32)(val&0xFFFFFFFF);
    val >>= 32;
    hi = (PHYSFS_uint32)(val&0xFFFFFFFF);
    val = PHYSFS_Swap32(lo);
    val <<= 32;
    val |= PHYSFS_Swap32(hi);
    return val;
}